

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbstractDOMParser.cpp
# Opt level: O2

void __thiscall
xercesc_4_0::AbstractDOMParser::endElement
          (AbstractDOMParser *this,XMLElementDecl *param_1,uint param_2,bool param_3,XMLCh *param_4)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined7 in_register_00000009;
  undefined4 in_register_00000014;
  DOMNode *pDVar4;
  DOMDocumentImpl *parsedDocument;
  XIncludeUtils xiu;
  XIncludeUtils XStack_28;
  DOMNode *pDVar3;
  
  pDVar3 = this->fCurrentParent;
  this->fCurrentNode = pDVar3;
  iVar2 = (*pDVar3->_vptr_DOMNode[5])
                    (pDVar3,param_1,CONCAT44(in_register_00000014,param_2),
                     CONCAT71(in_register_00000009,param_3));
  pDVar3 = (DOMNode *)CONCAT44(extraout_var,iVar2);
  this->fCurrentParent = pDVar3;
  if (pDVar3 == (DOMNode *)0x0) {
    if (this->fDocument == (DOMDocumentImpl *)0x0) {
      pDVar3 = (DOMNode *)0x0;
    }
    else {
      iVar2 = (*(this->fDocument->super_DOMMemoryManager)._vptr_DOMMemoryManager[0x40])();
      pDVar3 = (DOMNode *)CONCAT44(extraout_var_00,iVar2);
      this->fCurrentNode = pDVar3;
      this->fCurrentParent = pDVar3;
    }
  }
  pDVar4 = &(this->fDocument->super_DOMDocument).super_DOMNode;
  if (this->fDocument == (DOMDocumentImpl *)0x0) {
    pDVar4 = (DOMNode *)0x0;
  }
  if (pDVar3 == pDVar4) {
    this->fWithinElement = false;
  }
  if (this->fDoXInclude != true) {
    return;
  }
  bVar1 = XIncludeUtils::isXIIncludeDOMNode(this->fCurrentNode);
  if (!bVar1) {
    bVar1 = XIncludeUtils::isXIFallbackDOMNode(this->fCurrentNode);
    if (!bVar1) {
      return;
    }
    iVar2 = (*this->fCurrentParent->_vptr_DOMNode[0x16])();
    bVar1 = XMLString::equals((XMLCh *)CONCAT44(extraout_var_02,iVar2),
                              (XMLCh *)XIncludeUtils::fgXIIIncludeNamespaceURI);
    if (bVar1) {
      return;
    }
  }
  XIncludeUtils::XIncludeUtils(&XStack_28,&this->super_XMLErrorReporter);
  parsedDocument = this->fDocument;
  if (parsedDocument != (DOMDocumentImpl *)0x0) {
    parsedDocument = (DOMDocumentImpl *)&parsedDocument->super_DOMDocument;
  }
  bVar1 = XIncludeUtils::parseDOMNodeDoingXInclude
                    (&XStack_28,this->fCurrentNode,(DOMDocument *)parsedDocument,
                     this->fScanner->fEntityHandler);
  if (bVar1) {
    iVar2 = (*this->fCurrentParent->_vptr_DOMNode[8])();
    this->fCurrentNode = (DOMNode *)CONCAT44(extraout_var_01,iVar2);
  }
  XIncludeUtils::~XIncludeUtils(&XStack_28);
  return;
}

Assistant:

void AbstractDOMParser::endElement( const   XMLElementDecl&
                           , const unsigned int
                           , const bool
                           , const XMLCh* const)
{
    fCurrentNode   = fCurrentParent;
    fCurrentParent = fCurrentNode->getParentNode ();

    // When the document is invalid but we continue parsing, we may
    // end up seeing more 'end' events than the 'start' ones.
    //
    if (fCurrentParent == 0 && fDocument != 0)
    {
      fCurrentNode = fDocument->getDocumentElement ();
      fCurrentParent = fCurrentNode;
    }

    // If we've hit the end of content, clear the flag.
    //
    if (fCurrentParent == fDocument)
        fWithinElement = false;

    if(fDoXInclude &&
       (XIncludeUtils::isXIIncludeDOMNode(fCurrentNode) ||
        ((XIncludeUtils::isXIFallbackDOMNode(fCurrentNode) &&
          !XMLString::equals(fCurrentParent->getNamespaceURI(), XIncludeUtils::fgXIIIncludeNamespaceURI)))))
    {
    	XIncludeUtils xiu((XMLErrorReporter *) this);
	    // process the XInclude node, then update the fCurrentNode with the new content
	    if(xiu.parseDOMNodeDoingXInclude(fCurrentNode, fDocument, getScanner()->getEntityHandler()))
            fCurrentNode = fCurrentParent->getLastChild();
    }
}